

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O1

void __thiscall chrono::ChParticleCloud::ClampSpeed(ChParticleCloud *this)

{
  ChAparticle *pCVar1;
  ChAparticle *pCVar2;
  pointer ppCVar3;
  uint uVar4;
  ulong uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double local_48;
  double dStack_40;
  double local_38;
  double local_30;
  
  if (this->do_limit_speed == true) {
    ppCVar3 = (this->particles).
              super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->particles).
        super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppCVar3) {
      uVar4 = 1;
      uVar5 = 0;
      do {
        pCVar1 = ppCVar3[uVar5];
        auVar7._8_8_ = 0;
        auVar7._0_8_ = (pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.rot.
                       m_data[0];
        dVar6 = (pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.rot.m_data[1];
        auVar12._8_8_ = 0;
        auVar12._0_8_ = dVar6 * dVar6;
        auVar7 = vfmadd231sd_fma(auVar12,auVar7,auVar7);
        auVar14._8_8_ = 0;
        auVar14._0_8_ =
             (pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.rot.m_data[2];
        auVar7 = vfmadd213sd_fma(auVar14,auVar14,auVar7);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = (pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.rot.
                       m_data[3];
        auVar7 = vfmadd213sd_fma(auVar8,auVar8,auVar7);
        if (auVar7._0_8_ < 0.0) {
          dVar6 = sqrt(auVar7._0_8_);
        }
        else {
          auVar7 = vsqrtsd_avx(auVar7,auVar7);
          dVar6 = auVar7._0_8_;
        }
        dVar11 = (double)this->max_wvel;
        if (dVar11 < dVar6 + dVar6) {
          ppCVar3 = (this->particles).
                    super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pCVar1 = ppCVar3[uVar5];
          pCVar2 = ppCVar3[uVar5];
          local_30 = 1.0 / (dVar6 + dVar6);
          local_48 = local_30 *
                     dVar11 * ((ChQuaternion<double> *)
                              ((long)&(pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.
                                      coord_dt + 0x18))->m_data[0];
          dStack_40 = local_30 *
                      dVar11 * *(double *)
                                ((long)&(pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.
                                        coord_dt + 0x20);
          local_38 = local_30 *
                     dVar11 * *(double *)
                               ((long)&(pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.
                                       coord_dt + 0x28);
          local_30 = local_30 *
                     dVar11 * *(double *)
                               ((long)&(pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.
                                       coord_dt + 0x30);
          (**(code **)(*(long *)&(pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.
                                 super_ChFrame<double> + 0x40))(pCVar1,&local_48);
        }
        pCVar1 = (this->particles).
                 super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar5];
        auVar9._8_8_ = 0;
        auVar9._0_8_ = (pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.pos.
                       m_data[0];
        dVar6 = *(double *)
                 ((long)&(pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt + 8);
        auVar13._8_8_ = 0;
        auVar13._0_8_ = dVar6 * dVar6;
        auVar7 = vfmadd231sd_fma(auVar13,auVar9,auVar9);
        auVar10._8_8_ = 0;
        auVar10._0_8_ =
             *(double *)
              ((long)&(pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt + 0x10);
        auVar7 = vfmadd213sd_fma(auVar10,auVar10,auVar7);
        if (auVar7._0_8_ < 0.0) {
          dVar6 = sqrt(auVar7._0_8_);
        }
        else {
          auVar7 = vsqrtsd_avx(auVar7,auVar7);
          dVar6 = auVar7._0_8_;
        }
        dVar11 = (double)this->max_speed;
        if (dVar11 < dVar6) {
          ppCVar3 = (this->particles).
                    super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pCVar1 = ppCVar3[uVar5];
          pCVar2 = ppCVar3[uVar5];
          dVar6 = 1.0 / dVar6;
          local_48 = dVar6 * dVar11 * (pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.
                                      coord_dt.pos.m_data[0];
          dStack_40 = dVar6 * dVar11 * *(double *)
                                        ((long)&(pCVar2->super_ChParticleBase).
                                                super_ChFrameMoving<double>.coord_dt + 8);
          local_38 = dVar6 * dVar11 * *(double *)
                                       ((long)&(pCVar2->super_ChParticleBase).
                                               super_ChFrameMoving<double>.coord_dt + 0x10);
          (**(code **)(*(long *)&(pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.
                                 super_ChFrame<double> + 0x38))(pCVar1,&local_48);
        }
        uVar5 = (ulong)uVar4;
        ppCVar3 = (this->particles).
                  super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar4 = uVar4 + 1;
      } while (uVar5 < (ulong)((long)(this->particles).
                                     super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3 >> 3
                              ));
    }
  }
  return;
}

Assistant:

void ChParticleCloud::ClampSpeed() {
    if (GetLimitSpeed()) {
        for (unsigned int j = 0; j < particles.size(); j++) {
            double w = 2.0 * particles[j]->GetRot_dt().Length();
            if (w > max_wvel)
                particles[j]->SetRot_dt(particles[j]->GetRot_dt() * max_wvel / w);

            double v = particles[j]->GetPos_dt().Length();
            if (v > max_speed)
                particles[j]->SetPos_dt(particles[j]->GetPos_dt() * max_speed / v);
        }
    }
}